

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O1

nk_page_element * nk_create_page_element(nk_context *ctx)

{
  nk_allocation_type nVar1;
  uint uVar2;
  nk_page *pnVar3;
  nk_page_element *__s;
  ulong uVar4;
  ulong uVar5;
  nk_page_element *__s_00;
  
  __s = ctx->freelist;
  if (__s != (nk_page_element *)0x0) {
    ctx->freelist = __s->next;
    goto LAB_0013ea99;
  }
  if (ctx->use_pool == 0) {
    __s = (nk_page_element *)nk_buffer_alloc(&ctx->memory,NK_BUFFER_BACK,0x1d0,8);
    if (__s == (nk_page_element *)0x0) {
      __assert_fail("elem",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                    ,0x420c,"struct nk_page_element *nk_create_page_element(struct nk_context *)");
    }
    goto LAB_0013ea99;
  }
  pnVar3 = (ctx->pool).pages;
  if ((pnVar3 == (nk_page *)0x0) || ((ctx->pool).capacity <= pnVar3->size)) {
    nVar1 = (ctx->pool).type;
    if (nVar1 == NK_BUFFER_FIXED) {
      if (pnVar3 == (nk_page *)0x0) {
        __assert_fail("pool->pages",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x3e20,"struct nk_page_element *nk_pool_alloc(struct nk_pool *)");
      }
      if ((ctx->pool).capacity <= pnVar3->size) {
        __assert_fail("pool->pages->size < pool->capacity",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                      ,0x3e23,"struct nk_page_element *nk_pool_alloc(struct nk_pool *)");
      }
    }
    else {
      pnVar3 = (nk_page *)(*(ctx->pool).alloc.alloc)((ctx->pool).alloc.userdata,(void *)0x0,0x1de0);
      pnVar3->next = (ctx->pool).pages;
      (ctx->pool).pages = pnVar3;
      pnVar3->size = 0;
    }
    if (nVar1 != NK_BUFFER_FIXED) goto LAB_0013ea73;
    __s = (nk_page_element *)0x0;
  }
  else {
LAB_0013ea73:
    pnVar3 = (ctx->pool).pages;
    uVar2 = pnVar3->size;
    pnVar3->size = uVar2 + 1;
    __s = pnVar3->win + uVar2;
  }
  if (__s == (nk_page_element *)0x0) {
    __assert_fail("elem",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/drobilla[P]glfw/deps/nuklear.h"
                  ,0x4205,"struct nk_page_element *nk_create_page_element(struct nk_context *)");
  }
LAB_0013ea99:
  uVar4 = (ulong)__s & 3;
  if (uVar4 == 0) {
    uVar5 = 0x1d0;
    __s_00 = __s;
  }
  else {
    memset(__s,0,4 - uVar4);
    uVar5 = uVar4 | 0x1cc;
    __s_00 = (nk_page_element *)((4 - uVar4) + (long)__s);
  }
  uVar4 = (ulong)((uint)uVar5 & 0xfffffffc);
  memset(__s_00,0,uVar4);
  if ((uVar5 & 3) != 0) {
    memset((void *)((long)&__s_00->data + uVar4),0,uVar5 & 3);
  }
  __s->next = (nk_page_element *)0x0;
  __s->prev = (nk_page_element *)0x0;
  return __s;
}

Assistant:

NK_INTERN struct nk_page_element*
nk_create_page_element(struct nk_context *ctx)
{
    struct nk_page_element *elem;
    if (ctx->freelist) {
        /* unlink page element from free list */
        elem = ctx->freelist;
        ctx->freelist = elem->next;
    } else if (ctx->use_pool) {
        /* allocate page element from memory pool */
        elem = nk_pool_alloc(&ctx->pool);
        NK_ASSERT(elem);
        if (!elem) return 0;
    } else {
        /* allocate new page element from the back of the fixed size memory buffer */
        NK_STORAGE const nk_size size = sizeof(struct nk_page_element);
        NK_STORAGE const nk_size align = NK_ALIGNOF(struct nk_page_element);
        elem = (struct nk_page_element*)nk_buffer_alloc(&ctx->memory, NK_BUFFER_BACK, size, align);
        NK_ASSERT(elem);
        if (!elem) return 0;
    }
    nk_zero_struct(*elem);
    elem->next = 0;
    elem->prev = 0;
    return elem;
}